

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picker.cpp
# Opt level: O0

void __thiscall
QtMWidgets::Picker::insertItem(Picker *this,int index,QString *text,QVariant *userData)

{
  int iVar1;
  QAbstractItemModel *pQVar2;
  int iVar3;
  bool bVar4;
  int iVar5;
  int *piVar6;
  PickerPrivate *pPVar7;
  QStandardItemModel *this_00;
  QStandardItem *this_01;
  ulong uVar8;
  QModelIndex local_130;
  QModelIndex local_118;
  iterator local_100;
  int local_f4;
  iterator local_f0;
  QVariant local_e8;
  int local_c4;
  QMap<int,_QVariant> local_c0;
  QMap<int,_QVariant> values;
  QModelIndex local_98;
  undefined1 local_80 [8];
  QModelIndex item_1;
  QStandardItem *item;
  QStandardItemModel *m;
  QVariant *pQStack_28;
  int itemCount;
  QVariant *userData_local;
  QString *text_local;
  Picker *pPStack_10;
  int index_local;
  Picker *this_local;
  
  pQStack_28 = userData;
  userData_local = (QVariant *)text;
  text_local._4_4_ = index;
  pPStack_10 = this;
  m._4_4_ = count(this);
  m._0_4_ = 0;
  piVar6 = qBound<int>((int *)&m,(int *)((long)&text_local + 4),(int *)((long)&m + 4));
  iVar1 = *piVar6;
  text_local._4_4_ = iVar1;
  pPVar7 = QScopedPointer<QtMWidgets::PickerPrivate,_QScopedPointerDeleter<QtMWidgets::PickerPrivate>_>
           ::operator->(&this->d);
  if (iVar1 < pPVar7->maxCount) {
    pPVar7 = QScopedPointer<QtMWidgets::PickerPrivate,_QScopedPointerDeleter<QtMWidgets::PickerPrivate>_>
             ::operator->(&this->d);
    this_00 = qobject_cast<QStandardItemModel*>((QObject *)pPVar7->model);
    if (this_00 == (QStandardItemModel *)0x0) {
      pPVar7 = QScopedPointer<QtMWidgets::PickerPrivate,_QScopedPointerDeleter<QtMWidgets::PickerPrivate>_>
               ::operator->(&this->d);
      pPVar7->inserting = true;
      pPVar7 = QScopedPointer<QtMWidgets::PickerPrivate,_QScopedPointerDeleter<QtMWidgets::PickerPrivate>_>
               ::operator->(&this->d);
      iVar1 = text_local._4_4_;
      pQVar2 = pPVar7->model;
      pPVar7 = QScopedPointer<QtMWidgets::PickerPrivate,_QScopedPointerDeleter<QtMWidgets::PickerPrivate>_>
               ::operator->(&this->d);
      QPersistentModelIndex::operator_cast_to_QModelIndex((QModelIndex *)&item_1.m,&pPVar7->root);
      uVar8 = (**(code **)(*(long *)pQVar2 + 0xf8))(pQVar2,iVar1,1,&item_1.m);
      if ((uVar8 & 1) == 0) {
        pPVar7 = QScopedPointer<QtMWidgets::PickerPrivate,_QScopedPointerDeleter<QtMWidgets::PickerPrivate>_>
                 ::operator->(&this->d);
        pPVar7->inserting = false;
      }
      else {
        pPVar7 = QScopedPointer<QtMWidgets::PickerPrivate,_QScopedPointerDeleter<QtMWidgets::PickerPrivate>_>
                 ::operator->(&this->d);
        iVar3 = text_local._4_4_;
        pQVar2 = pPVar7->model;
        pPVar7 = QScopedPointer<QtMWidgets::PickerPrivate,_QScopedPointerDeleter<QtMWidgets::PickerPrivate>_>
                 ::operator->(&this->d);
        iVar1 = pPVar7->modelColumn;
        pPVar7 = QScopedPointer<QtMWidgets::PickerPrivate,_QScopedPointerDeleter<QtMWidgets::PickerPrivate>_>
                 ::operator->(&this->d);
        QPersistentModelIndex::operator_cast_to_QModelIndex(&local_98,&pPVar7->root);
        (**(code **)(*(long *)pQVar2 + 0x60))(local_80,pQVar2,iVar3,iVar1,&local_98);
        bVar4 = QVariant::isValid(pQStack_28);
        if (bVar4) {
          QMap<int,_QVariant>::QMap(&local_c0);
          bVar4 = QString::isNull((QString *)userData_local);
          if (!bVar4) {
            local_c4 = 0;
            QVariant::QVariant(&local_e8,(QString *)userData_local);
            local_f0._M_node = (_Base_ptr)QMap<int,_QVariant>::insert(&local_c0,&local_c4,&local_e8)
            ;
            QVariant::~QVariant(&local_e8);
          }
          bVar4 = QVariant::isValid(pQStack_28);
          if (bVar4) {
            local_f4 = 0x100;
            local_100._M_node =
                 (_Base_ptr)QMap<int,_QVariant>::insert(&local_c0,&local_f4,pQStack_28);
          }
          bVar4 = QMap<int,_QVariant>::isEmpty(&local_c0);
          if (!bVar4) {
            pPVar7 = QScopedPointer<QtMWidgets::PickerPrivate,_QScopedPointerDeleter<QtMWidgets::PickerPrivate>_>
                     ::operator->(&this->d);
            (**(code **)(*(long *)pPVar7->model + 0xb8))(pPVar7->model,local_80,&local_c0);
          }
          QMap<int,_QVariant>::~QMap(&local_c0);
        }
        else {
          pPVar7 = QScopedPointer<QtMWidgets::PickerPrivate,_QScopedPointerDeleter<QtMWidgets::PickerPrivate>_>
                   ::operator->(&this->d);
          pQVar2 = pPVar7->model;
          QVariant::QVariant((QVariant *)&values,(QString *)userData_local);
          (**(code **)(*(long *)pQVar2 + 0x98))(pQVar2,local_80,(QVariant *)&values,0);
          QVariant::~QVariant((QVariant *)&values);
        }
        pPVar7 = QScopedPointer<QtMWidgets::PickerPrivate,_QScopedPointerDeleter<QtMWidgets::PickerPrivate>_>
                 ::operator->(&this->d);
        pPVar7->inserting = false;
        pPVar7 = QScopedPointer<QtMWidgets::PickerPrivate,_QScopedPointerDeleter<QtMWidgets::PickerPrivate>_>
                 ::operator->(&this->d);
        QPersistentModelIndex::operator_cast_to_QModelIndex(&local_118,&pPVar7->root);
        _q_rowsInserted(this,&local_118,text_local._4_4_,text_local._4_4_);
        m._4_4_ = m._4_4_ + 1;
      }
    }
    else {
      this_01 = (QStandardItem *)operator_new(0x10);
      QStandardItem::QStandardItem(this_01,(QString *)userData_local);
      bVar4 = QVariant::isValid(pQStack_28);
      if (bVar4) {
        (**(code **)(*(long *)this_01 + 0x20))(this_01,pQStack_28,0x100);
      }
      QStandardItemModel::insertRow(this_00,text_local._4_4_,this_01);
      m._4_4_ = m._4_4_ + 1;
    }
    iVar1 = m._4_4_;
    pPVar7 = QScopedPointer<QtMWidgets::PickerPrivate,_QScopedPointerDeleter<QtMWidgets::PickerPrivate>_>
             ::operator->(&this->d);
    if (pPVar7->maxCount < iVar1) {
      pPVar7 = QScopedPointer<QtMWidgets::PickerPrivate,_QScopedPointerDeleter<QtMWidgets::PickerPrivate>_>
               ::operator->(&this->d);
      iVar3 = m._4_4_;
      pQVar2 = pPVar7->model;
      iVar5 = m._4_4_ + -1;
      pPVar7 = QScopedPointer<QtMWidgets::PickerPrivate,_QScopedPointerDeleter<QtMWidgets::PickerPrivate>_>
               ::operator->(&this->d);
      iVar1 = pPVar7->maxCount;
      pPVar7 = QScopedPointer<QtMWidgets::PickerPrivate,_QScopedPointerDeleter<QtMWidgets::PickerPrivate>_>
               ::operator->(&this->d);
      QPersistentModelIndex::operator_cast_to_QModelIndex(&local_130,&pPVar7->root);
      (**(code **)(*(long *)pQVar2 + 0x108))(pQVar2,iVar5,iVar3 - iVar1,&local_130);
    }
  }
  return;
}

Assistant:

void
Picker::insertItem( int index, const QString & text, const QVariant & userData )
{
	int itemCount = count();

	index = qBound( 0, index, itemCount );

	if( index >= d->maxCount )
		return;

	// For the common case where we are using the built in QStandardItemModel
	// construct a QStandardItem, reducing the number of expensive signals from
	// the model
	if( QStandardItemModel * m = qobject_cast< QStandardItemModel* > ( d->model ) )
	{
		QStandardItem * item = new QStandardItem( text );
		if( userData.isValid() ) item->setData( userData, Qt::UserRole );
		m->insertRow( index, item );
		++itemCount;
	}
	else
	{
		d->inserting = true;

		if( d->model->insertRows( index, 1, d->root ) )
		{
			QModelIndex item = d->model->index( index, d->modelColumn, d->root );

			if( !userData.isValid() )
				d->model->setData( item, text, Qt::DisplayRole );
			else
			{
				QMap< int, QVariant > values;

				if( !text.isNull() ) values.insert( Qt::DisplayRole, text );
				if( userData.isValid() ) values.insert( Qt::UserRole, userData );
				if( !values.isEmpty() ) d->model->setItemData( item, values );
			}

			d->inserting = false;

			_q_rowsInserted( d->root, index, index );

			++itemCount;
		}
		else
			d->inserting = false;
	}

	if( itemCount > d->maxCount )
		d->model->removeRows( itemCount - 1, itemCount - d->maxCount, d->root );
}